

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

CGraph * __thiscall Escape::CGraph::renameByDegreeOrder(CGraph *__return_storage_ptr__,CGraph *this)

{
  ulong uVar1;
  EdgeIdx *pEVar2;
  long lVar3;
  EdgeIdx *pEVar4;
  VertexIdx *pVVar5;
  Pair *__first;
  void *pvVar6;
  void *pvVar7;
  VertexIdx *pVVar8;
  long lVar9;
  Pair *pPVar10;
  long lVar11;
  EdgeIdx EVar12;
  ulong uVar13;
  ulong uVar14;
  
  newCGraph(__return_storage_ptr__,this->nVertices,this->nEdges);
  uVar1 = this->nVertices;
  uVar14 = 0;
  __first = (Pair *)operator_new__(-(ulong)(uVar1 >> 0x3c != 0) | uVar1 * 0x10);
  uVar13 = -(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8;
  pvVar6 = operator_new__(uVar13);
  pvVar7 = operator_new__(uVar13);
  pEVar2 = this->offsets;
  uVar13 = uVar1;
  if ((long)uVar1 < 1) {
    uVar13 = uVar14;
  }
  pVVar8 = &__first->second;
  for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    ((Pair *)(pVVar8 + -1))->first = uVar14;
    *pVVar8 = pEVar2[uVar14 + 1] - pEVar2[uVar14];
    pVVar8 = pVVar8 + 2;
  }
  std::__sort<Escape::Pair*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Escape::Pair,Escape::Pair)>>
            (__first,__first + uVar1,(_Iter_comp_iter<bool_(*)(Escape::Pair,_Escape::Pair)>)0x1027a8
            );
  lVar9 = 0;
  pPVar10 = __first;
  lVar11 = this->nVertices;
  if (this->nVertices < 1) {
    lVar11 = lVar9;
  }
  for (; lVar11 != lVar9; lVar9 = lVar9 + 1) {
    lVar3 = pPVar10->first;
    *(long *)((long)pvVar6 + lVar3 * 8) = lVar9;
    *(long *)((long)pvVar7 + lVar9 * 8) = lVar3;
    pPVar10 = pPVar10 + 1;
  }
  pEVar2 = __return_storage_ptr__->offsets;
  *pEVar2 = 0;
  pEVar4 = this->offsets;
  pVVar8 = __return_storage_ptr__->nbors;
  lVar9 = 0;
  for (lVar11 = 0; lVar11 < this->nVertices; lVar11 = lVar11 + 1) {
    lVar3 = *(long *)((long)pvVar7 + lVar11 * 8);
    pVVar5 = this->nbors;
    for (EVar12 = pEVar4[lVar3]; EVar12 < pEVar4[lVar3 + 1]; EVar12 = EVar12 + 1) {
      pVVar8[lVar9] = *(VertexIdx *)((long)pvVar6 + pVVar5[EVar12] * 8);
      lVar9 = lVar9 + 1;
    }
    pEVar2[lVar11 + 1] = lVar9;
  }
  operator_delete__(pvVar6);
  operator_delete__(pvVar7);
  operator_delete__(__first);
  return __return_storage_ptr__;
}

Assistant:

CGraph CGraph::renameByDegreeOrder() const {
    CGraph ret = newCGraph(nVertices, nEdges);
    Pair *deg_info = new Pair[nVertices];

    VertexIdx *mapping = new VertexIdx[nVertices];
    VertexIdx *inverse = new VertexIdx[nVertices];

    // Construct array of pairs, storing old vertex label and degree
    for (VertexIdx i = 0; i < nVertices; i++) {
        deg_info[i].first = i;
        deg_info[i].second = offsets[i + 1] - offsets[i];
    }

    // sort the pairs by degree (if degree is same, sort by old vertex label)
    std::sort(deg_info, deg_info + nVertices, Escape::pairCompareSecond);

    // Construct the mapping of old vertex label to new vertex label
    // So mapping[i] is what i is mapped to
    // And inverse[i] is what maps to i
    for (VertexIdx i = 0; i < nVertices; i++) {
        mapping[deg_info[i].first] = i;
        inverse[i] = deg_info[i].first;
    }

    // Initialize offsets of output CGraph
    ret.offsets[0] = 0;
    EdgeIdx current = 0;


    // Loop over new vertices
    for (VertexIdx new_label = 0; new_label < nVertices; new_label++) {
        VertexIdx old_label = inverse[new_label]; // corresponding old label for new vertices
        for (EdgeIdx pos = offsets[old_label]; pos < offsets[old_label + 1]; pos++) // loop over neighbors of old label
        {
            VertexIdx old_nbr = nbors[pos];
            VertexIdx new_nbr = mapping[old_nbr]; //corresponding new neighbor
            ret.nbors[current] = new_nbr; // insert new neighbor in nbors of output
            current++;
        }
        ret.offsets[new_label +
                    1] = current; // all neighbors of new_label have been added, so we set offset for new_label+1
    }

    delete[] mapping;
    delete[] inverse;
    delete[] deg_info;
    return ret;
}